

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O2

int log_map_insert(log_map map,char *key,void *value)

{
  log_map_bucket *pplVar1;
  size_t *psVar2;
  log_map_bucket_conflict plVar3;
  int iVar4;
  size_t sVar5;
  log_map_bucket_conflict plVar6;
  ulong uVar7;
  ulong uVar8;
  log_map_bucket plVar9;
  
  sVar5 = log_map_hash_fnv1(key);
  plVar6 = (map->table).data;
  uVar8 = (map->table).size - 1 & sVar5;
  plVar3 = plVar6 + uVar8;
  plVar9 = plVar3;
  if (plVar6[uVar8].key == (char *)0x0) {
    psVar2 = &(map->table).count;
    *psVar2 = *psVar2 + 1;
    plVar3->key = key;
    plVar3->value = value;
    plVar3->next = (log_map_bucket)0x0;
  }
  else {
    do {
      iVar4 = strcmp(plVar9->key,key);
      if (iVar4 == 0) {
        plVar9->value = value;
        return 0;
      }
      pplVar1 = &plVar9->next;
      plVar9 = *pplVar1;
    } while (*pplVar1 != (log_map_bucket)0x0);
    psVar2 = &(map->table).count;
    *psVar2 = *psVar2 + 1;
    uVar8 = (map->block).count;
    uVar7 = (map->block).position;
    if (0xff < uVar7) {
      if ((map->block).size <= uVar8) {
        return 1;
      }
      plVar6 = (log_map_bucket_conflict)malloc(0x1800);
      if (plVar6 == (log_map_bucket_conflict)0x0) {
        return 1;
      }
      (map->block).data[uVar8] = plVar6;
      uVar8 = uVar8 + 1;
      (map->block).count = uVar8;
      uVar7 = 0;
    }
    plVar6 = (map->block).data[uVar8 - 1];
    plVar6[uVar7].key = key;
    plVar6[uVar7].value = value;
    plVar6[uVar7].next = plVar3->next;
    plVar3->next = plVar6 + uVar7;
    (map->block).position = uVar7 + 1;
  }
  return 0;
}

Assistant:

int log_map_insert(log_map map, const char *key, const void *value)
{
	size_t hash = log_map_hash_fnv1(key) & (map->table.size - 1);

	log_map_bucket head = &map->table.data[hash];

	log_map_bucket bucket = head;

	if (head->key != NULL)
	{
		do
		{
			if (strcmp(bucket->key, key) == 0)
			{
				bucket->value = value;

				return 0;
			}

			bucket = bucket->next;

		} while (bucket != NULL);
	}

	++map->table.count;

	if (head->key == NULL)
	{
		head->key = key;
		head->value = value;
		head->next = NULL;

		return 0;
	}

	if (map->block.position >= LOG_MAP_BUCKET_SIZE)
	{
		log_map_bucket buckets = NULL;

		if (map->block.count >= map->block.size)
		{
			return 1;
		}

		buckets = malloc(sizeof(struct log_map_bucket_type) * LOG_MAP_BUCKET_SIZE);

		if (buckets == NULL)
		{
			return 1;
		}

		map->block.data[map->block.count] = buckets;

		map->block.position = 0;

		++map->block.count;
	}

	bucket = map->block.data[map->block.count - 1] + map->block.position;

	bucket->key = key;
	bucket->value = value;
	bucket->next = head->next;
	head->next = bucket;

	++map->block.position;

	return 0;
}